

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::EndRead3dmObjectTable(ON_BinaryArchive *this)

{
  ON__3dmV1LayerIndex *pOVar1;
  bool bVar2;
  int i;
  uint uVar3;
  ON__3dmV1LayerIndex *memblock;
  
  bVar2 = EndRead3dmTable(this,0x10000013);
  memblock = this->m_V1_layer_list;
  if (memblock != (ON__3dmV1LayerIndex *)0x0) {
    this->m_V1_layer_list = (ON__3dmV1LayerIndex *)0x0;
    for (uVar3 = 0; (memblock != (ON__3dmV1LayerIndex *)0x0 && (uVar3 < 1000)); uVar3 = uVar3 + 1) {
      pOVar1 = memblock->m_next;
      onfree(memblock);
      memblock = pOVar1;
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmObjectTable()
{
  bool rc = EndRead3dmTable( TCODE_OBJECT_TABLE );

  if ( 0 != m_V1_layer_list )
  {
    struct ON__3dmV1LayerIndex* next = m_V1_layer_list;
    m_V1_layer_list = 0;
    for ( int i = 0; 0 != next && i < 1000; i++ )
    {
      struct ON__3dmV1LayerIndex* p = next;
      next = p->m_next;
      onfree(p);
    }
  }

  return rc;
}